

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

string_t duckdb::FSSTVector::AddCompressedString(Vector *vector,string_t data)

{
  bool bVar1;
  VectorFSSTStringBuffer *this;
  undefined8 in_RDX;
  undefined8 in_RSI;
  VectorFSSTStringBuffer *fsst_string_buffer;
  VectorBuffer *in_stack_ffffffffffffffa0;
  shared_ptr<duckdb::VectorFSSTStringBuffer,_true> *in_stack_ffffffffffffffa8;
  shared_ptr<duckdb::VectorBuffer,_true> *in_stack_ffffffffffffffb0;
  anon_union_16_2_67f50693_for_value in_stack_ffffffffffffffb8;
  undefined1 local_10 [16];
  
  bVar1 = string_t::IsInlined((string_t *)0x2bd36dd);
  if (bVar1) {
    local_10._8_8_ = in_RDX;
    local_10._0_8_ = in_RSI;
  }
  else {
    bVar1 = shared_ptr<duckdb::VectorBuffer,_true>::operator_bool
                      ((shared_ptr<duckdb::VectorBuffer,_true> *)0x2bd370a);
    if (!bVar1) {
      make_buffer<duckdb::VectorFSSTStringBuffer>();
      shared_ptr<duckdb::VectorBuffer,_true>::operator=<duckdb::VectorFSSTStringBuffer,_0>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      shared_ptr<duckdb::VectorFSSTStringBuffer,_true>::~shared_ptr
                ((shared_ptr<duckdb::VectorFSSTStringBuffer,_true> *)0x2bd373a);
    }
    shared_ptr<duckdb::VectorBuffer,_true>::get((shared_ptr<duckdb::VectorBuffer,_true> *)0x2bd3764)
    ;
    this = VectorBuffer::Cast<duckdb::VectorFSSTStringBuffer>(in_stack_ffffffffffffffa0);
    local_10 = (undefined1  [16])
               VectorStringBuffer::AddBlob
                         (&this->super_VectorStringBuffer,(string_t)in_stack_ffffffffffffffb8);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10;
}

Assistant:

string_t FSSTVector::AddCompressedString(Vector &vector, string_t data) {
	D_ASSERT(vector.GetType().InternalType() == PhysicalType::VARCHAR);
	if (data.IsInlined()) {
		// string will be inlined: no need to store in string heap
		return data;
	}
	if (!vector.auxiliary) {
		vector.auxiliary = make_buffer<VectorFSSTStringBuffer>();
	}
	D_ASSERT(vector.auxiliary->GetBufferType() == VectorBufferType::FSST_BUFFER);
	auto &fsst_string_buffer = vector.auxiliary.get()->Cast<VectorFSSTStringBuffer>();
	return fsst_string_buffer.AddBlob(data);
}